

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O2

TargetList *
Analyser::Static::DiskII::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  uint uVar1;
  pointer psVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  Target *this;
  _Base_ptr p_Var6;
  Target *this_00;
  bool bVar7;
  bool bVar8;
  initializer_list<unsigned_short> __l;
  allocator_type local_283;
  unsigned_short local_282;
  _Any_data local_280 [2];
  shared_ptr<Storage::Disk::Track> track_zero;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_250;
  map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  sector_map;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  Disassembly disassembly;
  
  psVar2 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar2 == (media->disks).
                super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = (*((psVar2->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Disk[2])();
  if (0xa0 < iVar5) {
    this = (Target *)operator_new(0x90);
    AppleIIgs::Target::Target(this);
    disassembly.instructions_by_address._M_t._M_impl._0_8_ = this;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)&disassembly);
    if (disassembly.instructions_by_address._M_t._M_impl._0_8_ != 0) {
      (**(code **)(*(long *)disassembly.instructions_by_address._M_t._M_impl._0_8_ + 8))();
    }
    Media::operator=(&((__return_storage_ptr__->
                       super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                       super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                       .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl)->
                      media,media);
    return __return_storage_ptr__;
  }
  peVar3 = (psVar2->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar3->_vptr_Disk[4])(&track_zero,peVar3,0);
  Storage::Disk::track_serialisation
            ((PCMSegment *)&disassembly,
             track_zero.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (Time)0xc35000000001);
  Storage::Encodings::AppleGCR::sectors_from_segment(&sector_map,(PCMSegment *)&disassembly);
  Storage::Disk::PCMSegment::~PCMSegment((PCMSegment *)&disassembly);
  for (p_Var6 = sector_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &sector_map._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    if (*(char *)((long)&p_Var6[1]._M_parent + 2) == '\0') {
      local_208._8_8_ = 0;
      local_208._M_unused._M_object = (void *)0xb800;
      local_1f0 = std::
                  _Function_handler<unsigned_long_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/DiskII/../Disassembler/AddressMapper.hpp:20:9)>
                  ::_M_invoke;
      local_1f8 = std::
                  _Function_handler<unsigned_long_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/DiskII/../Disassembler/AddressMapper.hpp:20:9)>
                  ::_M_manager;
      std::function<unsigned_long(unsigned_short)>::function<std::function<unsigned_long(int)>,void>
                ((function<unsigned_long(unsigned_short)> *)local_280[0]._M_pod_data,
                 (function<unsigned_long_(int)> *)&local_208);
      local_282 = 0xb800;
      __l._M_len = 1;
      __l._M_array = &local_282;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_250,__l,
                 &local_283);
      MOS6502::Disassemble
                (&disassembly,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6[1]._M_left,
                 (function<unsigned_long_(unsigned_short)> *)local_280,
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_250);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_250);
      std::_Function_base::~_Function_base((_Function_base *)local_280);
      std::_Function_base::~_Function_base((_Function_base *)&local_208);
      bVar7 = false;
      goto LAB_0015c8a7;
    }
  }
  if (sector_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    disassembly.instructions_by_address._M_t._M_impl._0_8_ =
         anon_unknown.dwarf_2530fd::AppleIITarget((Sector *)0x0);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)&disassembly);
    if (disassembly.instructions_by_address._M_t._M_impl._0_8_ != 0) {
      (**(code **)(*(long *)disassembly.instructions_by_address._M_t._M_impl._0_8_ + 8))();
    }
    Media::operator=(&((__return_storage_ptr__->
                       super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                       super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                       .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl)->
                      media,media);
  }
LAB_0015c9cd:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  ::~_Rb_tree(&sector_map._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&track_zero.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
LAB_0015c8a7:
  bVar8 = (_Rb_tree_header *)
          disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          == &disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header;
  bVar4 = !bVar8;
  if (bVar8) goto LAB_0015c8f5;
  uVar1 = *(uint *)&disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_left[1]._M_parent;
  if (((ulong)uVar1 < 0x2a) && ((0x2a000000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    bVar7 = *(short *)&disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left[1].field_0x4 == 0x31c &&
            *(int *)((long)&disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left[1]._M_parent + 4) == 0;
  }
  else if (bVar7) {
    bVar7 = false;
    if ((uVar1 == 0x2b) &&
       (*(short *)&disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left[1].field_0x4 == 0xfb)) goto LAB_0015c8f5;
  }
  else {
    bVar7 = false;
  }
  disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::_Rb_tree_increment
                 (disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left);
  goto LAB_0015c8a7;
LAB_0015c8f5:
  for (; (_Rb_tree_header *)
         disassembly.outward_calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
         &disassembly.outward_calls._M_t._M_impl.super__Rb_tree_header;
      disassembly.outward_calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment
                     (disassembly.outward_calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     )) {
    bVar4 = (bool)(bVar4 | (ushort)((short)disassembly.outward_calls._M_t._M_impl.
                                           super__Rb_tree_header._M_header._M_left[1]._M_color - 800
                                   ) < 0xe0);
  }
  if (bVar4) {
    this_00 = (Target *)operator_new(0xc0);
    Oric::Target::Target(this_00);
    this_00->rom = Pravetz;
    this_00->disk_interface = Pravetz;
    std::__cxx11::string::assign((char *)&this_00->loading_command);
    local_280[0]._0_8_ = this_00;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_280);
  }
  else {
    local_280[0]._0_8_ = anon_unknown.dwarf_2530fd::AppleIITarget((Sector *)&p_Var6[1]._M_parent);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_280);
  }
  if ((Target *)local_280[0]._0_8_ != (Target *)0x0) {
    (**(code **)(*(long *)local_280[0]._0_8_ + 8))();
  }
  Media::operator=(&((__return_storage_ptr__->
                     super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                     super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                     .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl)->media,
                   media);
  MOS6502::Disassembly::~Disassembly(&disassembly);
  goto LAB_0015c9cd;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::DiskII::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	// This analyser can comprehend disks only.
	if(media.disks.empty()) return {};

	auto &disk = media.disks.front();
	TargetList targets;

	// If the disk image is too large for a 5.25" disk, map this to the IIgs.
	if(disk->get_maximum_head_position() > Storage::Disk::HeadPosition(40)) {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIIgsTarget()));
		targets.back()->media = media;
		return targets;
	}

	// Grab track 0, sector 0: the boot sector.
	const auto track_zero = disk->get_track_at_position(Storage::Disk::Track::Address(0, Storage::Disk::HeadPosition(0)));
	const auto sector_map = Storage::Encodings::AppleGCR::sectors_from_segment(
		Storage::Disk::track_serialisation(*track_zero, Storage::Time(1, 50000)));

	const Storage::Encodings::AppleGCR::Sector *sector_zero = nullptr;
	for(const auto &pair: sector_map) {
		if(!pair.second.address.sector) {
			sector_zero = &pair.second;
			break;
		}
	}

	// If there's no boot sector then if there are also no sectors at all,
	// decline to nominate a machine. Otherwise go with an Apple as the default.
	if(!sector_zero) {
		if(sector_map.empty()) {
			return targets;
		} else {
			targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIITarget(nullptr)));
			targets.back()->media = media;
			return targets;
		}
	}

	// If the boot sector looks like it's intended for the Oric, create an Oric.
	// Otherwise go with the Apple II.

	const auto disassembly = Analyser::Static::MOS6502::Disassemble(sector_zero->data, Analyser::Static::Disassembler::OffsetMapper(0xb800), {0xb800});

	bool did_read_shift_register = false;
	bool is_oric = false;

	// Look for a tight BPL loop reading the Oric's shift register address of 0x31c. The Apple II just has RAM there,
	// so the probability of such a loop is infinitesimal.
	for(const auto &instruction: disassembly.instructions_by_address) {
		// Is this a read of the shift register?
		if(
			(
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDA) ||
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDX) ||
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDY)
			) &&
			instruction.second.addressing_mode == Analyser::Static::MOS6502::Instruction::Absolute &&
			instruction.second.address == 0x031c) {
			did_read_shift_register = true;
			continue;
		}

		if(did_read_shift_register) {
			if(
				instruction.second.operation == Analyser::Static::MOS6502::Instruction::BPL &&
				instruction.second.address == 0xfb) {
				is_oric = true;
				break;
			}

			did_read_shift_register = false;
		}
	}

	// Check also for calls into the 0x3xx page above 0x320, as that's where the Oric's boot ROM is.
	for(const auto address: disassembly.outward_calls) {
		is_oric |= address >= 0x320 && address < 0x400;
	}

	if(is_oric) {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(OricTarget(sector_zero)));
	} else {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIITarget(sector_zero)));
	}
	targets.back()->media = media;
	return targets;
}